

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_modifiers_test.h
# Opt level: O0

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
InsertOrAssign<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL,_std::mutex>_>
::TestBody(InsertOrAssign<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL,_std::mutex>_>
           *this)

{
  bool bVar1;
  char *pcVar2;
  reference ppVar3;
  type *ptVar4;
  type *ptVar5;
  char *in_R9;
  AssertHelper local_8f0;
  Message local_8e8;
  undefined1 local_8e0 [8];
  AssertionResult gtest_ar_3;
  Message local_8c8;
  undefined1 local_8c0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_890;
  Message local_888;
  bool local_879;
  undefined1 local_878 [8];
  AssertionResult gtest_ar__1;
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_829;
  undefined1 local_828 [8];
  V val2;
  Message local_800;
  undefined1 local_7f8 [8];
  AssertionResult gtest_ar_1;
  Message local_7e0;
  undefined1 local_7d8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_7a8;
  Message local_7a0;
  undefined1 local_798 [8];
  AssertionResult gtest_ar_;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  p;
  undefined1 local_740 [8];
  TypeParam m;
  undefined1 local_38 [8];
  V val;
  K k;
  InsertOrAssign<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL,_std::mutex>_>
  *this_local;
  
  val.field_2._12_4_ =
       hash_internal::Generator<phmap::priv::hash_internal::Enum,_void>::operator()
                 ((Generator<phmap::priv::hash_internal::Enum,_void> *)
                  (val.field_2._M_local_buf + 0xb));
  hash_internal::
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  operator()((string *)local_38,
             (Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
              *)((long)&m.
                        super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .
                        super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .sets_._M_elems[0xf].set_.settings_ + 0x1f));
  parallel_flat_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL,_std::mutex>
  ::parallel_flat_hash_map
            ((parallel_flat_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL,_std::mutex>
              *)local_740);
  parallel_hash_map<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>>
  ::insert_or_assign<phmap::priv::hash_internal::Enum,std::__cxx11::string>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&gtest_ar_.message_,
             (parallel_hash_map<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>>
              *)local_740,
             (key_arg<phmap::priv::hash_internal::Enum> *)(val.field_2._M_local_buf + 0xc),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_798,(bool *)&p.first.it_end_.field_1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
  if (!bVar1) {
    testing::Message::Message(&local_7a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_798,(AssertionResult *)"p.second",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x62,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7a8,&local_7a0);
    testing::internal::AssertHelper::~AssertHelper(&local_7a8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_7a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
  ppVar3 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::iterator::operator*((iterator *)&gtest_ar_.message_);
  ptVar4 = std::get<0ul,phmap::priv::hash_internal::Enum_const,std::__cxx11::string>(ppVar3);
  testing::internal::EqHelper::
  Compare<phmap::priv::hash_internal::Enum,_phmap::priv::hash_internal::Enum,_nullptr>
            ((EqHelper *)local_7d8,"k","get<0>(*p.first)",(Enum *)(val.field_2._M_local_buf + 0xc),
             ptVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d8);
  if (!bVar1) {
    testing::Message::Message(&local_7e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,99,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_7e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_7e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d8);
  ppVar3 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::iterator::operator*((iterator *)&gtest_ar_.message_);
  ptVar5 = std::get<1ul,phmap::priv::hash_internal::Enum_const,std::__cxx11::string>(ppVar3);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_7f8,"val","get<1>(*p.first)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,ptVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f8);
  if (!bVar1) {
    testing::Message::Message(&local_800);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&val2.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,100,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)((long)&val2.field_2 + 8),&local_800)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&val2.field_2 + 8));
    testing::Message::~Message(&local_800);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f8);
  hash_internal::
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  operator()((string *)local_828,&local_829);
  parallel_hash_map<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>>
  ::insert_or_assign<phmap::priv::hash_internal::Enum,std::__cxx11::string>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&gtest_ar__1.message_,
             (parallel_hash_map<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>>
              *)local_740,
             (key_arg<phmap::priv::hash_internal::Enum> *)(val.field_2._M_local_buf + 0xc),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_828);
  std::
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  ::operator=((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
               *)&gtest_ar_.message_,(type)&gtest_ar__1.message_);
  local_879 = (bool)(~p.first.it_end_.field_1._0_1_ & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_878,&local_879,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_878);
  if (!bVar1) {
    testing::Message::Message(&local_888);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_878,(AssertionResult *)"p.second",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_890,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=(&local_890,&local_888);
    testing::internal::AssertHelper::~AssertHelper(&local_890);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_888);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_878);
  ppVar3 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::iterator::operator*((iterator *)&gtest_ar_.message_);
  ptVar4 = std::get<0ul,phmap::priv::hash_internal::Enum_const,std::__cxx11::string>(ppVar3);
  testing::internal::EqHelper::
  Compare<phmap::priv::hash_internal::Enum,_phmap::priv::hash_internal::Enum,_nullptr>
            ((EqHelper *)local_8c0,"k","get<0>(*p.first)",(Enum *)(val.field_2._M_local_buf + 0xc),
             ptVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c0);
  if (!bVar1) {
    testing::Message::Message(&local_8c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_8c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_8c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c0);
  ppVar3 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::iterator::operator*((iterator *)&gtest_ar_.message_);
  ptVar5 = std::get<1ul,phmap::priv::hash_internal::Enum_const,std::__cxx11::string>(ppVar3);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_8e0,"val2","get<1>(*p.first)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_828,ptVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8e0);
  if (!bVar1) {
    testing::Message::Message(&local_8e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_8f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8f0,&local_8e8);
    testing::internal::AssertHelper::~AssertHelper(&local_8f0);
    testing::Message::~Message(&local_8e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8e0);
  std::__cxx11::string::~string((string *)local_828);
  parallel_flat_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL,_std::mutex>
  ::~parallel_flat_hash_map
            ((parallel_flat_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL,_std::mutex>
              *)local_740);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, InsertOrAssign) {
#ifdef UNORDERED_MAP_CXX17
  using std::get;
  using K = typename TypeParam::key_type;
  using V = typename TypeParam::mapped_type;
  K k = hash_internal::Generator<K>()();
  V val = hash_internal::Generator<V>()();
  TypeParam m;
  auto p = m.insert_or_assign(k, val);
  EXPECT_TRUE(p.second);
  EXPECT_EQ(k, get<0>(*p.first));
  EXPECT_EQ(val, get<1>(*p.first));
  V val2 = hash_internal::Generator<V>()();
  p = m.insert_or_assign(k, val2);
  EXPECT_FALSE(p.second);
  EXPECT_EQ(k, get<0>(*p.first));
  EXPECT_EQ(val2, get<1>(*p.first));
#endif
}